

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_encode(AMQP_VALUE value,AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  int result;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  AMQP_VALUE value_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if ((value == (AMQP_VALUE)0x0) || (encoder_output == (AMQPVALUE_ENCODER_OUTPUT)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_encode",0x1129,1,"Bad arguments: value = %p, encoder_output = %p",value,
                encoder_output);
    }
    l._4_4_ = 0x112a;
  }
  else {
    switch(value->type) {
    case AMQP_TYPE_NULL:
      l._4_4_ = encode_null(encoder_output,context);
      break;
    case AMQP_TYPE_BOOL:
      l._4_4_ = encode_boolean(encoder_output,context,(_Bool)((value->value).ubyte_value & 1));
      break;
    case AMQP_TYPE_UBYTE:
      l._4_4_ = encode_ubyte(encoder_output,context,(value->value).ubyte_value);
      break;
    case AMQP_TYPE_USHORT:
      l._4_4_ = encode_ushort(encoder_output,context,(value->value).ushort_value);
      break;
    case AMQP_TYPE_UINT:
      l._4_4_ = encode_uint(encoder_output,context,(value->value).uint_value);
      break;
    case AMQP_TYPE_ULONG:
      l._4_4_ = encode_ulong(encoder_output,context,(value->value).ulong_value);
      break;
    case AMQP_TYPE_BYTE:
      l._4_4_ = encode_byte(encoder_output,context,(value->value).byte_value);
      break;
    case AMQP_TYPE_SHORT:
      l._4_4_ = encode_short(encoder_output,context,(value->value).short_value);
      break;
    case AMQP_TYPE_INT:
      l._4_4_ = encode_int(encoder_output,context,(value->value).int_value);
      break;
    case AMQP_TYPE_LONG:
      l._4_4_ = encode_long(encoder_output,context,(value->value).long_value);
      break;
    case AMQP_TYPE_FLOAT:
      l._4_4_ = encode_float(encoder_output,context,(value->value).float_value);
      break;
    case AMQP_TYPE_DOUBLE:
      l._4_4_ = encode_double(encoder_output,context,(value->value).double_value);
      break;
    default:
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"amqpvalue_encode",0x1134,1,"Invalid type: %d",CONCAT44(uVar3,value->type));
      }
      l._4_4_ = 0x1135;
      break;
    case AMQP_TYPE_TIMESTAMP:
      l._4_4_ = encode_timestamp(encoder_output,context,(value->value).long_value);
      break;
    case AMQP_TYPE_UUID:
      l._4_4_ = encode_uuid(encoder_output,context,&(value->value).ubyte_value);
      break;
    case AMQP_TYPE_BINARY:
      l._4_4_ = encode_binary(encoder_output,context,
                              (uchar *)(value->value).described_value.descriptor,
                              (value->value).binary_value.length);
      break;
    case AMQP_TYPE_STRING:
      l._4_4_ = encode_string(encoder_output,context,
                              (char *)(value->value).described_value.descriptor);
      break;
    case AMQP_TYPE_SYMBOL:
      l._4_4_ = encode_symbol(encoder_output,context,
                              (char *)(value->value).described_value.descriptor);
      break;
    case AMQP_TYPE_LIST:
      l._4_4_ = encode_list(encoder_output,context,(value->value).binary_value.length,
                            (value->value).list_value.items);
      break;
    case AMQP_TYPE_MAP:
      l._4_4_ = encode_map(encoder_output,context,(value->value).binary_value.length,
                           (value->value).map_value.pairs);
      break;
    case AMQP_TYPE_ARRAY:
      l._4_4_ = encode_array(encoder_output,context,(value->value).binary_value.length,
                             (value->value).list_value.items);
      break;
    case AMQP_TYPE_DESCRIBED:
    case AMQP_TYPE_COMPOSITE:
      iVar1 = encode_descriptor_header(encoder_output,context);
      if (((iVar1 == 0) &&
          (iVar1 = amqpvalue_encode((value->value).described_value.descriptor,encoder_output,context
                                   ), iVar1 == 0)) &&
         (iVar1 = amqpvalue_encode((value->value).described_value.value,encoder_output,context),
         iVar1 == 0)) {
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                    ,"amqpvalue_encode",0x1190,1,"Failed encoding described or composite type");
        }
        l._4_4_ = 0x1191;
      }
    }
  }
  return l._4_4_;
}

Assistant:

int amqpvalue_encode(AMQP_VALUE value, AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_269: [If value or encoder_output are NULL, amqpvalue_encode shall fail and return a non-zero value.] */
    if ((value == NULL) ||
        (encoder_output == NULL))
    {
        LogError("Bad arguments: value = %p, encoder_output = %p",
            value, encoder_output);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;

        switch (value_data->type)
        {
        default:
            /* Codes_SRS_AMQPVALUE_01_271: [If encoding fails due to any error not specifically mentioned here, it shall return a non-zero value.] */
            LogError("Invalid type: %d", (int)value_data->type);
            result = MU_FAILURE;
            break;

        case AMQP_TYPE_NULL:
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = encode_null(encoder_output, context);
            break;

        case AMQP_TYPE_BOOL:
            result = encode_boolean(encoder_output, context, value_data->value.bool_value);
            break;

        case AMQP_TYPE_UBYTE:
            result = encode_ubyte(encoder_output, context, value_data->value.ubyte_value);
            break;

        case AMQP_TYPE_USHORT:
            result = encode_ushort(encoder_output, context, value_data->value.ushort_value);
            break;

        case AMQP_TYPE_UINT:
            result = encode_uint(encoder_output, context, value_data->value.uint_value);
            break;

        case AMQP_TYPE_ULONG:
            result = encode_ulong(encoder_output, context, value_data->value.ulong_value);
            break;

        case AMQP_TYPE_BYTE:
            result = encode_byte(encoder_output, context, value_data->value.byte_value);
            break;

        case AMQP_TYPE_SHORT:
            result = encode_short(encoder_output, context, value_data->value.short_value);
            break;

        case AMQP_TYPE_INT:
            result = encode_int(encoder_output, context, value_data->value.int_value);
            break;

        case AMQP_TYPE_LONG:
            result = encode_long(encoder_output, context, value_data->value.long_value);
            break;

        case AMQP_TYPE_FLOAT:
            result = encode_float(encoder_output, context, value_data->value.float_value);
            break;

        case AMQP_TYPE_DOUBLE:
            result = encode_double(encoder_output, context, value_data->value.double_value);
            break;

        case AMQP_TYPE_TIMESTAMP:
            result = encode_timestamp(encoder_output, context, value_data->value.timestamp_value);
            break;

        case AMQP_TYPE_UUID:
            result = encode_uuid(encoder_output, context, value_data->value.uuid_value);
            break;

        case AMQP_TYPE_BINARY:
            result = encode_binary(encoder_output, context, (const unsigned char*)value_data->value.binary_value.bytes, value_data->value.binary_value.length);
            break;

        case AMQP_TYPE_STRING:
            result = encode_string(encoder_output, context, value_data->value.string_value.chars);
            break;

        case AMQP_TYPE_SYMBOL:
            result = encode_symbol(encoder_output, context, value_data->value.symbol_value.chars);
            break;

        case AMQP_TYPE_LIST:
            result = encode_list(encoder_output, context, value_data->value.list_value.count, value_data->value.list_value.items);
            break;

        case AMQP_TYPE_ARRAY:
            result = encode_array(encoder_output, context, value_data->value.array_value.count, value_data->value.array_value.items);
            break;

        case AMQP_TYPE_MAP:
            result = encode_map(encoder_output, context, value_data->value.map_value.pair_count, value_data->value.map_value.pairs);
            break;

        case AMQP_TYPE_COMPOSITE:
        case AMQP_TYPE_DESCRIBED:
        {
            if ((encode_descriptor_header(encoder_output, context) != 0) ||
                (amqpvalue_encode(value_data->value.described_value.descriptor, encoder_output, context) != 0) ||
                (amqpvalue_encode(value_data->value.described_value.value, encoder_output, context) != 0))
            {
                LogError("Failed encoding described or composite type");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            break;
        }
        }
    }

    return result;
}